

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ControlledFragmentAssembler.h
# Opt level: O3

ControlledPollAction __thiscall
aeron::ControlledFragmentAssembler::onFragment
          (ControlledFragmentAssembler *this,AtomicBuffer *buffer,index_t offset,index_t length,
          Header *header)

{
  AtomicBuffer *this_00;
  byte bVar1;
  int iVar2;
  uint32_t limit;
  uint uVar3;
  ulong uVar4;
  ControlledPollAction CVar5;
  iterator iVar6;
  _Node_iterator<std::pair<const_int,_aeron::BufferBuilder>,_false,_false> _Var7;
  uint uVar8;
  pair<std::__detail::_Node_iterator<std::pair<const_int,_aeron::BufferBuilder>,_false,_false>,_bool>
  pVar9;
  AtomicBuffer msgBuffer;
  int local_90 [2];
  BufferBuilder *local_88;
  ControlledFragmentAssembler *local_80;
  Header local_78;
  AtomicBuffer local_48;
  
  this_00 = &header->m_buffer;
  iVar2 = header->m_offset;
  concurrent::AtomicBuffer::boundsCheck(this_00,iVar2 + 5,1);
  bVar1 = (header->m_buffer).m_buffer[(long)iVar2 + 5];
  if (bVar1 < 0xc0) {
    if ((char)bVar1 < '\0') {
      iVar2 = header->m_offset;
      concurrent::AtomicBuffer::boundsCheck(this_00,iVar2 + 0xc,4);
      local_78.m_context =
           (void *)CONCAT44(local_78.m_context._4_4_,
                            *(undefined4 *)((header->m_buffer).m_buffer + (long)iVar2 + 0xc));
      local_48._vptr_AtomicBuffer._0_4_ = (index_t)this->m_initialBufferLength;
      pVar9 = std::
              _Hashtable<int,std::pair<int_const,aeron::BufferBuilder>,std::allocator<std::pair<int_const,aeron::BufferBuilder>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              ::_M_emplace<int,unsigned_int>
                        ((_Hashtable<int,std::pair<int_const,aeron::BufferBuilder>,std::allocator<std::pair<int_const,aeron::BufferBuilder>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                          *)&this->m_builderBySessionIdMap);
      _Var7 = pVar9.first.
              super__Node_iterator_base<std::pair<const_int,_aeron::BufferBuilder>,_false>._M_cur;
      *(undefined4 *)
       ((long)_Var7.super__Node_iterator_base<std::pair<const_int,_aeron::BufferBuilder>,_false>.
              _M_cur + 0x1c) = 0x20;
      BufferBuilder::ensureCapacity
                ((BufferBuilder *)
                 ((long)_Var7.
                        super__Node_iterator_base<std::pair<const_int,_aeron::BufferBuilder>,_false>
                        ._M_cur + 0x10),length);
      memcpy((void *)((ulong)*(uint *)((long)_Var7.
                                             super__Node_iterator_base<std::pair<const_int,_aeron::BufferBuilder>,_false>
                                             ._M_cur + 0x1c) +
                     *(long *)((long)_Var7.
                                     super__Node_iterator_base<std::pair<const_int,_aeron::BufferBuilder>,_false>
                                     ._M_cur + 0x20)),buffer->m_buffer + offset,(ulong)(uint)length)
      ;
      *(int *)((long)_Var7.
                     super__Node_iterator_base<std::pair<const_int,_aeron::BufferBuilder>,_false>.
                     _M_cur + 0x1c) =
           *(int *)((long)_Var7.
                          super__Node_iterator_base<std::pair<const_int,_aeron::BufferBuilder>,_false>
                          ._M_cur + 0x1c) + length;
      CVar5 = CONTINUE;
    }
    else {
      iVar2 = header->m_offset;
      local_80 = this;
      concurrent::AtomicBuffer::boundsCheck(this_00,iVar2 + 0xc,4);
      local_78.m_context =
           (void *)CONCAT44(local_78.m_context._4_4_,
                            *(undefined4 *)((header->m_buffer).m_buffer + (long)iVar2 + 0xc));
      iVar6 = std::
              _Hashtable<int,_std::pair<const_int,_aeron::BufferBuilder>,_std::allocator<std::pair<const_int,_aeron::BufferBuilder>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&(this->m_builderBySessionIdMap)._M_h,(key_type *)&local_78);
      CVar5 = CONTINUE;
      if ((iVar6.super__Node_iterator_base<std::pair<const_int,_aeron::BufferBuilder>,_false>._M_cur
           != (__node_type *)0x0) &&
         (limit = *(uint32_t *)
                   ((long)iVar6.
                          super__Node_iterator_base<std::pair<const_int,_aeron::BufferBuilder>,_false>
                          ._M_cur + 0x1c), limit != 0x20)) {
        local_88 = (BufferBuilder *)
                   ((long)iVar6.
                          super__Node_iterator_base<std::pair<const_int,_aeron::BufferBuilder>,_false>
                          ._M_cur + 0x10);
        BufferBuilder::ensureCapacity(local_88,length);
        memcpy((void *)((ulong)*(uint *)((long)iVar6.
                                               super__Node_iterator_base<std::pair<const_int,_aeron::BufferBuilder>,_false>
                                               ._M_cur + 0x1c) +
                       *(long *)((long)iVar6.
                                       super__Node_iterator_base<std::pair<const_int,_aeron::BufferBuilder>,_false>
                                       ._M_cur + 0x20)),buffer->m_buffer + offset,
               (ulong)(uint)length);
        uVar8 = length + *(int *)((long)iVar6.
                                        super__Node_iterator_base<std::pair<const_int,_aeron::BufferBuilder>,_false>
                                        ._M_cur + 0x1c);
        *(uint *)((long)iVar6.
                        super__Node_iterator_base<std::pair<const_int,_aeron::BufferBuilder>,_false>
                        ._M_cur + 0x1c) = uVar8;
        if (0x3f < bVar1) {
          concurrent::AtomicBuffer::AtomicBuffer
                    (&local_48,
                     *(uint8_t **)
                      ((long)iVar6.
                             super__Node_iterator_base<std::pair<const_int,_aeron::BufferBuilder>,_false>
                             ._M_cur + 0x20),(ulong)uVar8);
          local_78.m_context = header->m_context;
          local_78.m_buffer._vptr_AtomicBuffer = (_func_int **)&PTR__AtomicBuffer_001639d8;
          uVar4._0_4_ = header->m_offset;
          uVar4._4_4_ = header->m_initialTermId;
          local_78.m_positionBitsToShift = header->m_positionBitsToShift;
          local_78.m_buffer.m_buffer = local_48.m_buffer;
          local_78.m_buffer.m_length = local_48.m_length;
          local_78._32_8_ = uVar4 & 0xffffffff00000000;
          concurrent::AtomicBuffer::boundsCheck(&local_48,0,0x20);
          *(uint *)local_48.m_buffer = uVar8;
          iVar2 = header->m_offset;
          concurrent::AtomicBuffer::boundsCheck(this_00,iVar2 + 0xc,4);
          *(uint *)((long)local_48.m_buffer + 0xc) =
               *(uint *)((header->m_buffer).m_buffer + (long)iVar2 + 0xc);
          iVar2 = header->m_offset;
          concurrent::AtomicBuffer::boundsCheck(this_00,iVar2 + 0x10,4);
          *(uint *)((long)local_48.m_buffer + 0x10) =
               *(uint *)((header->m_buffer).m_buffer + (long)iVar2 + 0x10);
          iVar2 = header->m_offset;
          concurrent::AtomicBuffer::boundsCheck(this_00,iVar2 + 0x14,4);
          *(uint *)((long)local_48.m_buffer + 0x14) =
               *(uint *)((header->m_buffer).m_buffer + (long)iVar2 + 0x14);
          *(undefined1 *)((long)local_48.m_buffer + 5) = 0xc0;
          *(undefined2 *)((long)local_48.m_buffer + 6) = 1;
          iVar2 = header->m_offset;
          uVar3 = *(uint *)local_48.m_buffer;
          concurrent::AtomicBuffer::boundsCheck(this_00,iVar2,4);
          *(uint *)((long)local_48.m_buffer + 8) =
               (iVar2 - uVar3) + *(int *)((header->m_buffer).m_buffer + iVar2);
          local_90[1] = 0x20;
          local_90[0] = uVar8 - 0x20;
          if ((local_80->m_delegate).super__Function_base._M_manager == (_Manager_type)0x0)
          goto LAB_0013c681;
          CVar5 = (*(local_80->m_delegate)._M_invoker)
                            ((_Any_data *)&local_80->m_delegate,&local_48,local_90 + 1,local_90,
                             &local_78);
          if (CVar5 == ABORT) {
            BufferBuilder::limit(local_88,limit);
          }
          else {
            *(undefined4 *)
             ((long)iVar6.
                    super__Node_iterator_base<std::pair<const_int,_aeron::BufferBuilder>,_false>.
                    _M_cur + 0x1c) = 0x20;
          }
        }
      }
    }
  }
  else {
    local_78.m_context = (void *)CONCAT44(local_78.m_context._4_4_,offset);
    local_48._vptr_AtomicBuffer._0_4_ = length;
    if ((this->m_delegate).super__Function_base._M_manager == (_Manager_type)0x0) {
LAB_0013c681:
      std::__throw_bad_function_call();
    }
    CVar5 = (*(this->m_delegate)._M_invoker)
                      ((_Any_data *)&this->m_delegate,buffer,(int *)&local_78,(int *)&local_48,
                       header);
  }
  return CVar5;
}

Assistant:

ControlledPollAction onFragment(AtomicBuffer& buffer, util::index_t offset, util::index_t length, Header& header)
    {
        const std::uint8_t flags = header.flags();
        ControlledPollAction action = ControlledPollAction::CONTINUE;

        if ((flags & FrameDescriptor::UNFRAGMENTED) == FrameDescriptor::UNFRAGMENTED)
        {
            action = m_delegate(buffer, offset, length, header);
        }
        else
        {
            if ((flags & FrameDescriptor::BEGIN_FRAG) == FrameDescriptor::BEGIN_FRAG)
            {
                auto result = m_builderBySessionIdMap.emplace(header.sessionId(), static_cast<std::uint32_t>(m_initialBufferLength));
                BufferBuilder& builder = result.first->second;

                builder
                    .reset()
                    .append(buffer, offset, length, header);
            }
            else
            {
                auto result = m_builderBySessionIdMap.find(header.sessionId());

                if (result != m_builderBySessionIdMap.end())
                {
                    BufferBuilder& builder = result->second;
                    const std::uint32_t limit = builder.limit();

                    if (builder.limit() != DataFrameHeader::LENGTH)
                    {
                        builder.append(buffer, offset, length, header);

                        if ((flags & FrameDescriptor::END_FRAG) == FrameDescriptor::END_FRAG)
                        {
                            const util::index_t msgLength = builder.limit() - DataFrameHeader::LENGTH;
                            AtomicBuffer msgBuffer(builder.buffer(), builder.limit());
                            Header assemblyHeader(header);

                            assemblyHeader.buffer(msgBuffer);
                            assemblyHeader.offset(0);
                            DataFrameHeader::DataFrameHeaderDefn& frame(
                                msgBuffer.overlayStruct<DataFrameHeader::DataFrameHeaderDefn>());

                            frame.frameLength = DataFrameHeader::LENGTH + msgLength;
                            frame.sessionId = header.sessionId();
                            frame.streamId = header.streamId();
                            frame.termId = header.termId();
                            frame.flags = FrameDescriptor::UNFRAGMENTED;
                            frame.type = DataFrameHeader::HDR_TYPE_DATA;
                            frame.termOffset = header.termOffset() - (frame.frameLength - header.frameLength());

                            action = m_delegate(msgBuffer, DataFrameHeader::LENGTH, msgLength, assemblyHeader);

                            if (ControlledPollAction::ABORT == action)
                            {
                                builder.limit(limit);
                            }
                            else
                            {
                                builder.reset();
                            }
                        }
                    }
                }
            }
        }

        return action;
    }